

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O3

Stream * rw::readSkinLegacy(Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  Frame *f;
  uint numNodes;
  int32 iVar1;
  uint uVar2;
  Skin *this;
  HAnimHierarchy *pHVar3;
  HAnimData *pHVar4;
  long lVar5;
  long lVar6;
  Matrix mat;
  Matrix local_70;
  
  lVar5 = *(long *)((long)object + 0x28);
  numNodes = Stream::readI32(stream);
  iVar1 = Stream::readI32(stream);
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/skin.cpp line: 265"
  ;
  this = (Skin *)(*DAT_00149de8)(0x70,0x30116);
  *(Skin **)(lVar5 + skinGlobals) = this;
  Skin::init(this,(EVP_PKEY_CTX *)(ulong)numNodes);
  this->legacyType = 1;
  this->numWeights = 4;
  (*stream->_vptr_Stream[4])(stream,this->indices,(ulong)(uint)(iVar1 * 4));
  Stream::read32(stream,this->weights,iVar1 << 4);
  pHVar3 = HAnimHierarchy::create(numNodes,(int32 *)0x0,(int32 *)0x0,0,0x24);
  if (0 < (int)numNodes) {
    lVar6 = 4;
    lVar5 = 0;
    do {
      iVar1 = Stream::readI32(stream);
      *(int32 *)((long)pHVar3->nodeInfo + lVar6 + -4) = iVar1;
      iVar1 = Stream::readI32(stream);
      *(int32 *)((long)&pHVar3->nodeInfo->id + lVar6) = iVar1;
      uVar2 = Stream::readI32(stream);
      *(uint *)((long)&pHVar3->nodeInfo->index + lVar6) = uVar2 & 3;
      Stream::read32(stream,(void *)((long)this->inverseMatrices + lVar5),0x40);
      Matrix::invert(&local_70,(Matrix *)((long)this->inverseMatrices + lVar5));
      lVar6 = lVar6 + 0x18;
      lVar5 = lVar5 + 0x40;
    } while ((ulong)numNodes << 6 != lVar5);
  }
  f = *(Frame **)(*(long *)((long)object + 8) + 0xb0);
  pHVar4 = HAnimData::get(f);
  pHVar4->hierarchy = pHVar3;
  pHVar3->parentFrame = f;
  return stream;
}

Assistant:

static Stream*
readSkinLegacy(Stream *stream, int32 len, void *object, int32, int32)
{
	Atomic *atomic = (Atomic*)object;
	Geometry *geometry = atomic->geometry;

	int32 numBones = stream->readI32();
	int32 numVertices = stream->readI32();
	assert(numVertices == geometry->numVertices);

	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, skinGlobals.geoOffset) = skin;
	skin->init(numBones, numBones, numVertices);
	skin->legacyType = 1;
	skin->numWeights = 4;

	stream->read8(skin->indices, numVertices*4);
	stream->read32(skin->weights, numVertices*16);

	HAnimHierarchy *hier = HAnimHierarchy::create(numBones, nil, nil, 0, 36);

	for(int i = 0; i < numBones; i++){
		hier->nodeInfo[i].id = stream->readI32();
		hier->nodeInfo[i].index = stream->readI32();
		hier->nodeInfo[i].flags = stream->readI32() & 3;
//		printf("%d %d %d %d\n", i, hier->nodeInfo[i].id, hier->nodeInfo[i].index, hier->nodeInfo[i].flags);
		stream->read32(&skin->inverseMatrices[i*16], 64);

		Matrix mat;
		Matrix::invert(&mat, (Matrix*)&skin->inverseMatrices[i*16]);
//		printf("[ [ %8.4f, %8.4f, %8.4f, %8.4f ]\n"
//		       "  [ %8.4f, %8.4f, %8.4f, %8.4f ]\n"
//		       "  [ %8.4f, %8.4f, %8.4f, %8.4f ]\n"
//		       "  [ %8.4f, %8.4f, %8.4f, %8.4f ] ]\n"
//			"  %08x == flags\n",
//			mat.right.x, mat.up.x, mat.at.x, mat.pos.x,
//			mat.right.y, mat.up.y, mat.at.y, mat.pos.y,
//			mat.right.z, mat.up.z, mat.at.z, mat.pos.z,
//			0.0f, 0.0f, 0.0f, 1.0f,
//			mat.flags);
	}
	Frame *frame = atomic->getFrame()->child;
	assert(frame->next == nil);	// in old files atomic is above hierarchy it seems
	assert(frame->count() == numBones);	// assuming one frame per node this should also be true
	HAnimData::get(frame)->hierarchy = hier;
	hier->parentFrame = frame;

	return stream;
}